

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
spirv_cross::Compiler::get_common_basic_type(Compiler *this,SPIRType *type,BaseType *base_type)

{
  TypedID<(spirv_cross::Types)1> *pTVar1;
  size_t sVar2;
  bool bVar3;
  undefined8 in_RAX;
  SPIRType *type_00;
  long lVar4;
  BaseType member_base;
  undefined8 uStack_38;
  
  if (type->basetype == Struct) {
    *base_type = Unknown;
    pTVar1 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
    ;
    sVar2 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size;
    uStack_38 = in_RAX;
    for (lVar4 = 0; sVar2 << 2 != lVar4; lVar4 = lVar4 + 4) {
      type_00 = get<spirv_cross::SPIRType>(this,*(uint32_t *)((long)&pTVar1->id + lVar4));
      bVar3 = get_common_basic_type(this,type_00,(BaseType *)((long)&uStack_38 + 4));
      if (!bVar3) {
        return false;
      }
      if (*base_type == Unknown) {
        *base_type = uStack_38._4_4_;
      }
      else if (*base_type != uStack_38._4_4_) {
        return false;
      }
    }
  }
  else {
    *base_type = type->basetype;
  }
  return true;
}

Assistant:

bool Compiler::get_common_basic_type(const SPIRType &type, SPIRType::BaseType &base_type)
{
	if (type.basetype == SPIRType::Struct)
	{
		base_type = SPIRType::Unknown;
		for (auto &member_type : type.member_types)
		{
			SPIRType::BaseType member_base;
			if (!get_common_basic_type(get<SPIRType>(member_type), member_base))
				return false;

			if (base_type == SPIRType::Unknown)
				base_type = member_base;
			else if (base_type != member_base)
				return false;
		}
		return true;
	}
	else
	{
		base_type = type.basetype;
		return true;
	}
}